

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O3

int __thiscall ORPG::ExpressionTree::parse_tree(ExpressionTree *this,parse_node *node)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Die *this_00;
  Die *pDVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  size_t __nmemb;
  float fVar11;
  
  iVar8 = 1;
LAB_00103360:
  iVar2 = 0;
  if (node != (parse_node *)0x0) {
    sVar1 = node->op;
    uVar9 = (ulong)(uint)(int)sVar1;
    if ((int)sVar1 == 0) {
      uVar9 = 0;
      iVar2 = 0;
      if (node->value != 0) goto switchD_001033ab_caseD_3;
      goto LAB_00103940;
    }
    if (sVar1 == 3) goto code_r0x0010337c;
    switch(sVar1) {
    case 1:
      iVar2 = node->value;
      break;
    case 2:
      if (node->left == (parse_node *)0x0) {
        iVar6 = parse_tree(this,node->right);
        iVar5 = 1;
      }
      else {
        iVar5 = parse_tree(this,node->left);
        iVar6 = parse_tree(this,node->right);
        if (iVar5 == 0) break;
      }
      iVar2 = iVar6;
      if (2 < iVar6 + 1U) {
        this_00 = (Die *)operator_new(4);
        iVar2 = 2;
        if (2 < iVar6) {
          iVar2 = iVar6;
        }
        this_00->_MAX = iVar2;
        if (0 < iVar5) {
          iVar2 = 0;
          do {
            uVar3 = Die::roll(this_00);
            if ((0 < (int)uVar3 && (int)(uVar3 ^ 0x7fffffff) < iVar2) ||
               (iVar2 < (int)(-0x80000000 - uVar3) && (int)uVar3 < 0)) {
              printf("overflow");
            }
            iVar2 = iVar2 + uVar3;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          goto LAB_0010393b;
        }
        goto LAB_0010392d;
      }
      break;
    case 3:
      goto switchD_001033ab_caseD_3;
    case 4:
      iVar2 = parse_tree(this,node->left);
      iVar5 = parse_tree(this,node->right);
      fVar11 = ceilf((float)iVar2 / (float)iVar5);
      return iVar8 * (int)fVar11;
    case 5:
      iVar2 = parse_tree(this,node->left);
      uVar3 = parse_tree(this,node->right);
      if ((0 < (int)uVar3 && (int)(uVar3 ^ 0x7fffffff) < iVar2) ||
         (iVar2 < (int)(-0x80000000 - uVar3) && (int)uVar3 < 0)) {
        printf("overflow");
      }
      iVar2 = uVar3 + iVar2;
      break;
    case 6:
      iVar2 = parse_tree(this,node->left);
      uVar3 = parse_tree(this,node->right);
      if (((int)uVar3 < 0 && (int)(uVar3 + 0x7fffffff) < iVar2) ||
         (iVar2 < (int)(uVar3 | 0x80000000) && 0 < (int)uVar3)) {
        printf("overflow");
      }
      iVar2 = iVar2 - uVar3;
      break;
    case 7:
      iVar2 = parse_tree(this,node->left);
      iVar5 = parse_tree(this,node->right);
      return iVar8 * (iVar2 % iVar5);
    case 8:
      uVar3 = parse_tree(this,node->left->left);
      iVar5 = parse_tree(this,node->right);
      iVar6 = parse_tree(this,node->left->right);
      if ((uVar3 != 0) && (iVar2 = iVar6, 2 < iVar6 + 1U)) {
        __nmemb = (size_t)(int)uVar3;
        uVar9 = 0xffffffffffffffff;
        if (-1 < (int)uVar3) {
          uVar9 = __nmemb * 4;
        }
        this_00 = (Die *)operator_new__(uVar9);
        pDVar7 = (Die *)operator_new(4);
        iVar2 = 2;
        if (2 < iVar6) {
          iVar2 = iVar6;
        }
        pDVar7->_MAX = iVar2;
        if (0 < (int)uVar3) {
          uVar9 = 0;
          do {
            iVar2 = Die::roll(pDVar7);
            this_00[uVar9]._MAX = iVar2;
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        operator_delete(pDVar7);
        qsort(this_00,__nmemb,4,compare);
        if (iVar5 < 1) {
          iVar2 = 0;
        }
        else {
          lVar10 = (long)(int)(uVar3 - iVar5);
          iVar2 = 0;
          do {
            uVar3 = this_00[lVar10]._MAX;
            if ((0 < (int)uVar3 && (int)(uVar3 ^ 0x7fffffff) < iVar2) ||
               (iVar2 < (int)(-0x80000000 - uVar3) && (int)uVar3 < 0)) {
              printf("overflow");
            }
            iVar2 = iVar2 + uVar3;
            lVar10 = lVar10 + 1;
          } while (lVar10 < (long)__nmemb);
        }
        goto LAB_0010393b;
      }
      break;
    case 9:
      uVar3 = parse_tree(this,node->left->left);
      uVar4 = parse_tree(this,node->right);
      iVar5 = parse_tree(this,node->left->right);
      if ((uVar3 != 0) && (iVar2 = iVar5, 2 < iVar5 + 1U)) {
        uVar9 = 0xffffffffffffffff;
        if (-1 < (int)uVar3) {
          uVar9 = (long)(int)uVar3 * 4;
        }
        this_00 = (Die *)operator_new__(uVar9);
        pDVar7 = (Die *)operator_new(4);
        iVar2 = 2;
        if (2 < iVar5) {
          iVar2 = iVar5;
        }
        pDVar7->_MAX = iVar2;
        if (0 < (int)uVar3) {
          uVar9 = 0;
          do {
            iVar2 = Die::roll(pDVar7);
            this_00[uVar9]._MAX = iVar2;
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        operator_delete(pDVar7);
        qsort(this_00,(long)(int)uVar3,4,compare);
        if ((int)uVar4 < 1) {
LAB_0010392d:
          iVar2 = 0;
        }
        else {
          uVar9 = 0;
          iVar2 = 0;
          do {
            uVar3 = this_00[uVar9]._MAX;
            if ((0 < (int)uVar3 && (int)(uVar3 ^ 0x7fffffff) < iVar2) ||
               (iVar2 < (int)(-0x80000000 - uVar3) && (int)uVar3 < 0)) {
              printf("overflow");
            }
            iVar2 = iVar2 + uVar3;
            uVar9 = uVar9 + 1;
          } while (uVar4 != uVar9);
        }
LAB_0010393b:
        operator_delete__(this_00);
      }
      break;
    case 10:
      iVar5 = parse_tree(this,node->right);
      do {
        iVar2 = parse_tree(this,node->left);
      } while (iVar2 <= iVar5);
      break;
    case 0xb:
      iVar5 = parse_tree(this,node->right);
      do {
        iVar2 = parse_tree(this,node->left);
      } while (iVar2 < iVar5);
      break;
    case 0xc:
      iVar5 = parse_tree(this,node->right);
      do {
        iVar2 = parse_tree(this,node->left);
      } while (iVar5 <= iVar2);
      break;
    case 0xd:
      iVar5 = parse_tree(this,node->right);
      do {
        iVar2 = parse_tree(this,node->left);
      } while (iVar5 < iVar2);
      break;
    case 0xe:
      iVar5 = parse_tree(this,node->right);
      do {
        iVar6 = parse_tree(this,node->left);
      } while (iVar6 == iVar5);
      break;
    default:
      if (sVar1 != -1) {
switchD_001033ab_caseD_3:
        if ((char)Core::VB_FLAG == '\x01') {
          fprintf(_stderr,"Expression Parse Error: Invalid option - %c\n",uVar9);
        }
        exit(1);
      }
    }
  }
LAB_00103940:
  return iVar8 * iVar2;
code_r0x0010337c:
  iVar2 = parse_tree(this,node->left);
  node = node->right;
  iVar8 = iVar8 * iVar2;
  goto LAB_00103360;
}

Assistant:

int ExpressionTree::parse_tree(struct parse_node* node) {
        int high;
        int i;
        int limit;
        int low;
        int size;
        int reps;
        int tmp;
        int* results;
        Die* die;

        int ret = 0;

        /* sets our current node to node */
        auto curr = node;

        int sum = 0;

        if(!curr || (!curr->op && !curr->value)) {
            return 0;
        }

        switch(curr->op) {
        // error node
        case OP_ERR: {
            return 0;
        } break;

        // number node
        case OP_NUMBER: {
            sum = curr->value;
        } break;

        // n-sided die node
        case OP_DIE: {
            reps = curr->left ? parse_tree(curr->left) : 1;
            size = parse_tree(curr->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }

            die = new Die(size); 
            
            for(i = 0; i < reps; i++) {
                sum = checked_sum(sum, die->roll());
            }
            
            delete[] die;
        } break;

        // multiplication node
        case OP_TIMES: {
            sum = checked_multiplication(parse_tree(curr->left),
                                         parse_tree(curr->right));
        } break;

        // integer division node
        case OP_DIV: {
            sum = (int)
            ceil((float)parse_tree(curr->left) /
                        parse_tree(curr->right));
        } break;
        
        // addition node
        case OP_PLUS: {
            sum = checked_sum(parse_tree(curr->left),
                              parse_tree(curr->right));
        } break;
        
        // subtraction node
        case OP_MINUS: {
            sum = checked_sum(parse_tree(curr->left),
                             -parse_tree(curr->right));
        } break;

        // modulo node
        case OP_MOD: {
            sum = parse_tree(curr->left) % parse_tree(curr->right);
        } break;
        
        // keep highest results node
        case OP_HIGH: {
            reps = parse_tree(curr->left->left);
            high = parse_tree(curr->right);
            size = parse_tree(curr->left->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }

            // array to store the results to sort
            if (!(results = new int[reps])) {
                printf("out of memory");
                break;
            }
        
            Die* die = new Die(size);

            for(i = 0; i < reps; i++) {
                results[i] = die->roll();
            }

            delete die;

            qsort(results, reps, sizeof(int), &compare);

            for(i = (reps - high); i < reps; i++) {
                sum = checked_sum(sum, results[i]);
            }
        
            delete[] results;
        } break;
            
        // keep lowest resutls node
        case OP_LOW: {
            reps    = parse_tree(curr->left->left);
            low     = parse_tree(curr->right);
            size    = parse_tree(curr->left->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }
                    
            /* array to store the results to sort */
            if (!(results = new int[reps])) {
                printf("out of memory");
                break;
            }
        
            Die* die = new Die(size);

            for(i = 0; i < reps; i++) {
                results[i] = die->roll();
            }

            delete die;

            qsort(results, reps, sizeof(int), &compare);
        
            for(i = 0; i < low; i++) {
                sum = checked_sum(sum, results[i]);
            }
        
            delete[] results;
        } break;

        // keep results greater than
        case OP_GT: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
                
            while (tmp <= limit) {
                tmp = parse_tree(curr->left);
            }
                
            sum = checked_sum(sum, tmp);
        } break;

        // keep results greater or equal than
        case OP_GE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
            
            while (tmp < limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum( sum, tmp );
        } break;
            
        // keep results less than
        case OP_LT: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp >= limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum(sum, tmp);
        
        } break;
        
        // keep results less or equal than
        case OP_LE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp > limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum(sum, tmp);
        } break;
        
        // keep result not equal to
        case OP_NE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp == limit) {
                tmp = parse_tree(curr->left);      
            }
        
            return ret;
        } break;

        default: {
            if(Core::VB_FLAG) fprintf(stderr, "Expression Parse Error: Invalid option - %c\n", curr->op);
            exit(EXIT_FAILURE);
        }
        }

        ret = checked_sum(ret, sum);

        return ret;
    }